

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket.cc
# Opt level: O2

void * CSocekt::ServerSendQueueThread(void *threadData)

{
  list<char_*,_std::allocator<char_*>_> *this;
  CSocekt *this_00;
  _List_node_base *p_Var1;
  lp_connection_t c;
  size_t sVar2;
  _List_node_base *p_Var3;
  ushort uVar4;
  int iVar5;
  uint uVar6;
  CMemory *this_01;
  int *piVar7;
  self *psVar8;
  ulong v;
  LogStream *this_02;
  _Self __tmp;
  const_iterator cVar9;
  ushort *buff;
  SourceFile file;
  SourceFile file_00;
  SourceFile file_01;
  SourceFile file_02;
  SourceFile file_03;
  SourceFile file_04;
  MutexLockGuard lock;
  undefined1 local_1068 [12];
  undefined1 local_1058 [12];
  undefined1 local_1048 [12];
  undefined1 local_1038 [12];
  undefined1 local_1028 [12];
  undefined1 local_1018 [12];
  Logger local_1008;
  
  this_00 = *(CSocekt **)((long)threadData + 8);
  this_01 = CMemory::GetInstance();
  this = &this_00->m_MsgSendQueue;
LAB_00117759:
  do {
    if (g_stopEvent != 0) {
      return (void *)0x0;
    }
    iVar5 = sem_wait((sem_t *)&this_00->m_semEventSendQueue);
    if ((iVar5 == -1) && (piVar7 = __errno_location(), *piVar7 != 4)) {
      muduo::Logger::SourceFile::SourceFile<100>
                ((SourceFile *)local_1018,
                 (char (*) [100])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/IMIdealDragon[P]flydragon/net/flyd_socket.cc"
                );
      file._12_4_ = 0;
      file.data_ = (char *)local_1018._0_8_;
      file.size_ = local_1018._8_4_;
      muduo::Logger::Logger(&local_1008,file,0x2ab,ERROR);
      muduo::LogStream::operator<<(&local_1008.impl_.stream_,anon_var_dwarf_188f7);
      muduo::Logger::~Logger(&local_1008);
    }
    if (g_stopEvent != 0) {
      return (void *)0x0;
    }
    LOCK();
    iVar5 = (this_00->m_iSendMsgQueueCount).value_;
    if (iVar5 == 0) {
      (this_00->m_iSendMsgQueueCount).value_ = 0;
      iVar5 = 0;
    }
    UNLOCK();
  } while (iVar5 < 1);
  lock.mutex_ = &this_00->m_sendMessageQueueMutex;
  muduo::MutexLock::lock(&this_00->m_sendMessageQueueMutex);
  cVar9._M_node =
       (this->super__List_base<char_*,_std::allocator<char_*>_>)._M_impl._M_node.
       super__List_node_base._M_next;
LAB_001177fc:
  do {
    if (cVar9._M_node == (_List_node_base *)this) break;
    p_Var1 = cVar9._M_node[1]._M_next;
    c = (lp_connection_t)p_Var1->_M_next;
    if ((_List_node_base *)c->iCurrsequence == p_Var1->_M_prev) {
      sVar2 = this_00->m_iLenMsgHeader;
      LOCK();
      iVar5 = (c->iThrowsendCount).value_;
      if (iVar5 == 0) {
        (c->iThrowsendCount).value_ = 0;
        iVar5 = 0;
      }
      UNLOCK();
      buff = (ushort *)((long)&p_Var1->_M_next + sVar2);
      if (0 < iVar5) {
        cVar9._M_node = (cVar9._M_node)->_M_next;
        goto LAB_001177fc;
      }
      c->psendMemPointer = (char *)p_Var1;
      p_Var1 = (cVar9._M_node)->_M_next;
      std::__cxx11::list<char_*,_std::allocator<char_*>_>::erase(this,cVar9);
      LOCK();
      (this_00->m_iSendMsgQueueCount).value_ = (this_00->m_iSendMsgQueueCount).value_ + -1;
      UNLOCK();
      c->psendbuf = (char *)buff;
      uVar4 = *buff << 8 | *buff >> 8;
      uVar6 = (uint)uVar4;
      c->isendlen = (uint)uVar4;
      if (muduo::g_logLevel < 3) {
        muduo::Logger::SourceFile::SourceFile<100>
                  ((SourceFile *)local_1028,
                   (char (*) [100])
                   "/workspace/llm4binary/github/license_all_cmakelists_25/IMIdealDragon[P]flydragon/net/flyd_socket.cc"
                  );
        file_00._12_4_ = 0;
        file_00.data_ = (char *)local_1028._0_8_;
        file_00.size_ = local_1028._8_4_;
        muduo::Logger::Logger(&local_1008,file_00,0x2e5);
        psVar8 = muduo::LogStream::operator<<(&local_1008.impl_.stream_,anon_var_dwarf_18902);
        muduo::LogStream::operator<<(psVar8,c->isendlen);
        muduo::Logger::~Logger(&local_1008);
        buff = (ushort *)c->psendbuf;
        uVar6 = c->isendlen;
      }
      v = sendproc(this_00,c,(char *)buff,(ulong)uVar6);
      cVar9._M_node = p_Var1;
      if ((long)v < 1) {
        if (v != 0xffffffffffffffff) {
          if (v == 0) {
            CMemory::FreeMemory(this_01,c->psendMemPointer);
          }
          else {
            CMemory::FreeMemory(this_01,c->psendMemPointer);
          }
          c->psendMemPointer = (char *)0x0;
          goto LAB_001177fc;
        }
        LOCK();
        (c->iThrowsendCount).value_ = (c->iThrowsendCount).value_ + 1;
        UNLOCK();
        iVar5 = flyd_epoll_oper_event(this_00,c->fd,3,4,0,c);
        if (iVar5 != -1) goto LAB_001177fc;
        muduo::Logger::SourceFile::SourceFile<100>
                  ((SourceFile *)local_1068,
                   (char (*) [100])
                   "/workspace/llm4binary/github/license_all_cmakelists_25/IMIdealDragon[P]flydragon/net/flyd_socket.cc"
                  );
        file_04._12_4_ = 0;
        file_04.data_ = (char *)local_1068._0_8_;
        file_04.size_ = local_1068._8_4_;
        muduo::Logger::Logger(&local_1008,file_04,0x326,ERROR);
        muduo::LogStream::operator<<(&local_1008.impl_.stream_,anon_var_dwarf_1895c);
      }
      else if (v == c->isendlen) {
        CMemory::FreeMemory(this_01,c->psendMemPointer);
        c->psendMemPointer = (char *)0x0;
        if (2 < muduo::g_logLevel) goto LAB_001177fc;
        muduo::Logger::SourceFile::SourceFile<100>
                  ((SourceFile *)local_1038,
                   (char (*) [100])
                   "/workspace/llm4binary/github/license_all_cmakelists_25/IMIdealDragon[P]flydragon/net/flyd_socket.cc"
                  );
        file_01._12_4_ = 0;
        file_01.data_ = (char *)local_1038._0_8_;
        file_01.size_ = local_1038._8_4_;
        muduo::Logger::Logger(&local_1008,file_01,0x2f0);
        muduo::LogStream::operator<<(&local_1008.impl_.stream_,anon_var_dwarf_1890d);
      }
      else {
        c->psendbuf = c->psendbuf + v;
        c->isendlen = c->isendlen - (int)v;
        LOCK();
        (c->iThrowsendCount).value_ = (c->iThrowsendCount).value_ + 1;
        UNLOCK();
        iVar5 = flyd_epoll_oper_event(this_00,c->fd,3,4,0,c);
        if (iVar5 == -1) {
          muduo::Logger::SourceFile::SourceFile<100>
                    ((SourceFile *)local_1048,
                     (char (*) [100])
                     "/workspace/llm4binary/github/license_all_cmakelists_25/IMIdealDragon[P]flydragon/net/flyd_socket.cc"
                    );
          file_02._12_4_ = 0;
          file_02.data_ = (char *)local_1048._0_8_;
          file_02.size_ = local_1048._8_4_;
          muduo::Logger::Logger(&local_1008,file_02,0x302,ERROR);
          muduo::LogStream::operator<<(&local_1008.impl_.stream_,anon_var_dwarf_18918);
          muduo::Logger::~Logger(&local_1008);
        }
        muduo::Logger::SourceFile::SourceFile<100>
                  ((SourceFile *)local_1058,
                   (char (*) [100])
                   "/workspace/llm4binary/github/license_all_cmakelists_25/IMIdealDragon[P]flydragon/net/flyd_socket.cc"
                  );
        file_03._12_4_ = 0;
        file_03.data_ = (char *)local_1058._0_8_;
        file_03.size_ = local_1058._8_4_;
        muduo::Logger::Logger(&local_1008,file_03,0x304,ERROR);
        psVar8 = muduo::LogStream::operator<<(&local_1008.impl_.stream_,anon_var_dwarf_1892f);
        this_02 = muduo::LogStream::operator<<(psVar8,c->isendlen);
        psVar8 = muduo::LogStream::operator<<(this_02,anon_var_dwarf_18946);
        psVar8 = muduo::LogStream::operator<<(psVar8,anon_var_dwarf_18951);
        muduo::LogStream::operator<<(psVar8,v);
      }
      muduo::Logger::~Logger(&local_1008);
      goto LAB_001177fc;
    }
    p_Var3 = (cVar9._M_node)->_M_next;
    std::__cxx11::list<char_*,_std::allocator<char_*>_>::erase(this,cVar9);
    LOCK();
    (this_00->m_iSendMsgQueueCount).value_ = (this_00->m_iSendMsgQueueCount).value_ + -1;
    UNLOCK();
    CMemory::FreeMemory(this_01,p_Var1);
    cVar9._M_node = p_Var3;
  } while( true );
  muduo::MutexLockGuard::~MutexLockGuard(&lock);
  goto LAB_00117759;
}

Assistant:

void* CSocekt::ServerSendQueueThread(void* threadData)
{    
    ThreadItem *pThread = static_cast<ThreadItem*>(threadData);
    CSocekt *pSocketObj = pThread->_pThis;
    int err;
    std::list <char *>::iterator pos,pos2,posend;
    
    char *pMsgBuf;	
    LPSTRUC_MSG_HEADER	pMsgHeader;
	LPCOMM_PKG_HEADER   pPkgHeader;
    lp_connection_t     p_Conn;
    unsigned short      itmp;
    ssize_t             sendsize;  

    CMemory *p_memory = CMemory::GetInstance();
    
    while(g_stopEvent == 0) //不退出
    {
        //如果信号量值>0，则 -1(减1) 并走下去，否则卡这里卡着【为了让信号量值+1，可以在其他线程调用sem_post达到，实际上在CSocekt::msgSend()调用sem_post就达到了让这里sem_wait走下去的目的】
        //******如果被某个信号中断，sem_wait也可能过早的返回，错误为EINTR；
        //整个程序退出之前，也要sem_post()一下，确保如果本线程卡在sem_wait()，也能走下去从而让本线程成功返回
        if(sem_wait(&pSocketObj->m_semEventSendQueue) == -1)
        {
            //失败？及时报告，其他的也不好干啥
            if(errno != EINTR) //这个我就不算个错误了【当阻塞于某个慢系统调用的一个进程捕获某个信号且相应信号处理函数返回时，该系统调用可能返回一个EINTR错误。】
                LOG_ERROR << "CSocekt::ServerSendQueueThread()中sem_wait(&pSocketObj->m_semEventSendQueue)失败.";
        }

        //一般走到这里都表示需要处理数据收发了
        if(g_stopEvent != 0)  //要求整个进程退出
            break;

        if(pSocketObj->m_iSendMsgQueueCount.get() > 0) //原子的 
        {
            muduo::MutexLockGuard lock(pSocketObj->m_sendMessageQueueMutex);
            pos    = pSocketObj->m_MsgSendQueue.begin();
			posend = pSocketObj->m_MsgSendQueue.end();

            while(pos != posend)
            {
                pMsgBuf = (*pos);                          //拿到的每个消息都是 消息头+包头+包体【但要注意，我们是不发送消息头给客户端的】
                pMsgHeader = (LPSTRUC_MSG_HEADER)pMsgBuf;  //指向消息头
                pPkgHeader = (LPCOMM_PKG_HEADER)(pMsgBuf+pSocketObj->m_iLenMsgHeader);	//指向包头
                p_Conn = pMsgHeader->pConn;

                //包过期，因为如果 这个连接被回收，比如在ngx_close_connection(),inRecyConnectQueue()中都会自增iCurrsequence
                     //而且这里有没必要针对 本连接 来用m_connectionMutex临界 ,只要下面条件成立，肯定是客户端连接已断，要发送的数据肯定不需要发送了
                if(p_Conn->iCurrsequence != pMsgHeader->iCurrsequence) 
                {
                    //本包中保存的序列号与p_Conn【连接池中连接】中实际的序列号已经不同，丢弃此消息，小心处理该消息的删除
                    pos2=pos;
                    pos++;
                    pSocketObj->m_MsgSendQueue.erase(pos2);
                    pSocketObj->m_iSendMsgQueueCount.decrement(); //发送消息队列容量少1		
                    p_memory->FreeMemory(pMsgBuf);	
                    continue;
                } //end if

                if(p_Conn->iThrowsendCount.get() > 0) 
                {
                    //靠系统驱动来发送消息，所以这里不能再发送
                    pos++;
                    continue;
                }
            
                //走到这里，可以发送消息，一些必须的信息记录，要发送的东西也要从发送队列里干掉
                p_Conn->psendMemPointer = pMsgBuf;      //发送后释放用的，因为这段内存是new出来的
                pos2=pos;
				pos++;
                pSocketObj->m_MsgSendQueue.erase(pos2);
                pSocketObj->m_iSendMsgQueueCount.decrement();      //发送消息队列容量少1	
                p_Conn->psendbuf = (char *)pPkgHeader;   //要发送的数据的缓冲区指针，因为发送数据不一定全部都能发送出去，我们要记录数据发送到了哪里，需要知道下次数据从哪里开始发送
                itmp = ntohs(pPkgHeader->pkgLen);        //包头+包体 长度 ，打包时用了htons【本机序转网络序】，所以这里为了得到该数值，用了个ntohs【网络序转本机序】；
                p_Conn->isendlen = itmp;                 //要发送多少数据，因为发送数据不一定全部都能发送出去，我们需要知道剩余有多少数据还没发送
                                
                //这里是重点，我们采用 epoll水平触发的策略，能走到这里的，都应该是还没有投递 写事件 到epoll中
                    //epoll水平触发发送数据的改进方案：
	                //开始不把socket写事件通知加入到epoll,当我需要写数据的时候，直接调用write/send发送数据；
	                //如果返回了EAGIN【发送缓冲区满了，需要等待可写事件才能继续往缓冲区里写数据】，此时，我再把写事件通知加入到epoll，
	                //此时，就变成了在epoll驱动下写数据，全部数据发送完毕后，再把写事件通知从epoll中干掉；
	                //优点：数据不多的时候，可以避免epoll的写事件的增加/删除，提高了程序的执行效率；                         
                //(1)直接调用write或者send发送数据
             //   ngx_log_stderr(errno,"即将发送数据%ud。",p_Conn->isendlen);
                LOG_INFO << "即将发送数据" << p_Conn->isendlen;

                sendsize = pSocketObj->sendproc(p_Conn,p_Conn->psendbuf,p_Conn->isendlen); //注意参数
                if(sendsize > 0)
                {                    
                    if(sendsize == p_Conn->isendlen) //成功发送出去了数据，一下就发送出去这很顺利
                    {
                        //成功发送的和要求发送的数据相等，说明全部发送成功了 发送缓冲区去了【数据全部发完】
                        p_memory->FreeMemory(p_Conn->psendMemPointer);  //释放内存
                        p_Conn->psendMemPointer = NULL;
                       // p_Conn->iThrowsendCount = 0;  //这行其实可以没有，因此此时此刻这东西就是=0的                        
                        LOG_INFO << "CSocekt::ServerSendQueueThread()中数据发送完毕，很好。";
                    }
                    else  //没有全部发送完毕(EAGAIN)，数据只发出去了一部分，但肯定是因为 发送缓冲区满了,那么
                    {                        
                        //发送到了哪里，剩余多少，记录下来，方便下次sendproc()时使用
                        p_Conn->psendbuf = p_Conn->psendbuf + sendsize;
				        p_Conn->isendlen = p_Conn->isendlen - sendsize;	
                        //因为发送缓冲区慢了，所以 现在我要依赖系统通知来发送数据了
                        p_Conn->iThrowsendCount.increment();             //标记发送缓冲区满了，需要通过epoll事件来驱动消息的继续发送【原子+1，且不可写成p_Conn->iThrowsendCount = p_Conn->iThrowsendCount +1 ，这种写法不是原子+1】
                        if(pSocketObj->flyd_epoll_oper_event(
                                p_Conn->fd,         //socket句柄
                                EPOLL_CTL_MOD,      //事件类型，这里是增加【因为我们准备增加个写通知】
                                EPOLLOUT,           //标志，这里代表要增加的标志,EPOLLOUT：可写【可写的时候通知我】
                                0,                  //对于事件类型为增加的，EPOLL_CTL_MOD需要这个参数, 0：增加   1：去掉 2：完全覆盖
                                p_Conn              //连接池中的连接
                                ) == -1)
                        {
                            //有这情况发生？这可比较麻烦，不过先do nothing
                            LOG_ERROR << "CSocekt::ServerSendQueueThread()ngx_epoll_oper_event()失败.";
                        }
                            LOG_ERROR << "CSocekt::ServerSendQueueThread()中数据没发送完毕【发送缓冲区满】，整个要发送"<<p_Conn->isendlen << "字节， "<< "实际发送了" << sendsize;

                    } //end if(sendsize > 0)
                    continue;  //继续处理其他消息                    
                }  //end if(sendsize > 0)

                //能走到这里，应该是有点问题的
                else if(sendsize == 0)
                {
                    //发送0个字节，首先因为我发送的内容不是0个字节的；
                    //然后如果发送 缓冲区满则返回的应该是-1，而错误码应该是EAGAIN，所以我综合认为，这种情况我就把这个发送的包丢弃了【按对端关闭了socket处理】
                    //这个打印下日志，我还真想观察观察是否真有这种现象发生
                    //ngx_log_stderr(errno,"CSocekt::ServerSendQueueThread()中sendproc()居然返回0？"); //如果对方关闭连接出现send=0，那么这个日志可能会常出现，商用时就 应该干掉
                    //然后这个包干掉，不发送了
                    p_memory->FreeMemory(p_Conn->psendMemPointer);  //释放内存
                    p_Conn->psendMemPointer = NULL;
                   // p_Conn->iThrowsendCount = 0;  //这行其实可以没有，因此此时此刻这东西就是=0的    
                    continue;
                }

                //能走到这里，继续处理问题
                else if(sendsize == -1)
                {
                    //发送缓冲区已经满了【一个字节都没发出去，说明发送 缓冲区当前正好是满的】
                    p_Conn->iThrowsendCount.increment(); //标记发送缓冲区满了，需要通过epoll事件来驱动消息的继续发送
                    if(pSocketObj->flyd_epoll_oper_event(
                                p_Conn->fd,         //socket句柄
                                EPOLL_CTL_MOD,      //事件类型，这里是增加【因为我们准备增加个写通知】
                                EPOLLOUT,           //标志，这里代表要增加的标志,EPOLLOUT：可写【可写的时候通知我】
                                0,                  //对于事件类型为增加的，EPOLL_CTL_MOD需要这个参数, 0：增加   1：去掉 2：完全覆盖
                                p_Conn              //连接池中的连接
                                ) == -1)
                    {
                        //有这情况发生？这可比较麻烦，不过先do nothing
                        LOG_ERROR << "CSocekt::ServerSendQueueThread()中ngx_epoll_add_event()_2失败.";
                    }
                    continue;
                }

                else
                {
                    //能走到这里的，应该就是返回值-2了，一般就认为对端断开了，等待recv()来做断开socket以及回收资源
                    p_memory->FreeMemory(p_Conn->psendMemPointer);  //释放内存
                    p_Conn->psendMemPointer = NULL;
                   // p_Conn->iThrowsendCount = 0;  //这行其实可以没有，因此此时此刻这东西就是=0的  
                    continue;
                }

            } //end while(pos != posend)

            
        } //if(pSocketObj->m_iSendMsgQueueCount > 0)
    } //end while
    
    return (void*)0;
}